

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O0

vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
__thiscall IncrementalEditDistance::all_next(IncrementalEditDistance *this)

{
  action aVar1;
  reference pvVar2;
  char *pcVar3;
  IncrementalEditDistance *in_RSI;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *in_RDI;
  float fVar4;
  pair<unsigned_long,_double> pVar5;
  size_t n;
  size_t a;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *B;
  value_type *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float local_84;
  ulong local_58;
  pair<unsigned_long,_double> local_38;
  pair<unsigned_int,_float> local_28;
  ulong local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
         )0x11fe7e);
  for (local_20 = 1; local_20 < 0x1e; local_20 = local_20 + 1) {
    pVar5 = std::make_pair<unsigned_long&,double>
                      ((unsigned_long *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (double *)in_stack_ffffffffffffff68);
    local_38 = pVar5;
    std::pair<unsigned_int,_float>::pair<unsigned_long,_double,_true>(&local_28,&local_38);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    push_back((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              in_stack_ffffffffffffff68);
  }
  local_84 = (float)(in_RSI->prev_row[in_RSI->N] - in_RSI->prev_row_min);
  fVar4 = minf(in_RSI,100.0,local_84);
  aVar1 = char2action('$');
  pvVar2 = std::
           vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           ::operator[](in_RDI,(ulong)(aVar1 - 1));
  pvVar2->second = fVar4;
  for (local_58 = 0; local_58 < in_RSI->N; local_58 = local_58 + 1) {
    if (in_RSI->prev_row[local_58] == in_RSI->prev_row_min) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&in_RSI->target);
      aVar1 = char2action(*pcVar3);
      pvVar2 = std::
               vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ::operator[](in_RDI,(ulong)(aVar1 - 1));
      pvVar2->second = 0.0;
    }
  }
  return in_RDI;
}

Assistant:

vector< pair<action,float> > all_next()
  { vector< pair<action,float> > B;
    for (size_t a=1; a<=29; a++)
      B.push_back( make_pair(a, 1.) );
    B[ char2action('$')-1 ].second = minf(100., (float)(prev_row[N] - prev_row_min));
    for (size_t n=0; n<N; n++)
      if (prev_row[n] == prev_row_min)
        B[ char2action(target[n])-1 ].second = 0.;
    return B;
  }